

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::WriteAllBoardsBroadcast(BasePort *this)

{
  uchar *puVar1;
  BoardIO *pBVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ostream *poVar11;
  bool bVar12;
  char *pcVar13;
  bool bVar14;
  uint board;
  ulong uVar15;
  uint board_1;
  ulong uVar16;
  byte bVar17;
  byte bVar18;
  bool bVar19;
  allocator<char> local_51;
  quadlet_t ctrl;
  
  iVar6 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar6 == '\0') {
    poVar11 = this->outStr;
    pcVar13 = "BasePort::WriteAllBoardsBroadcast: port not initialized";
  }
  else {
    if (((this->IsAllBoardsRev4_6_ != false) || (this->IsAllBoardsRev7_ != false)) ||
       (this->IsAllBoardsRev8_9_ != false)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ctrl,"WriteAllBoardsBroadcast",&local_51);
      iVar6 = (*this->_vptr_BasePort[0x1b])(this,(string *)&ctrl,(ulong)this->autoReScan);
      std::__cxx11::string::~string((string *)&ctrl);
      if ((char)iVar6 != '\0') {
        puVar1 = this->WriteBufferBroadcast;
        uVar7 = (*this->_vptr_BasePort[0x17])(this);
        uVar8 = (*this->_vptr_BasePort[0x14])(this,2);
        uVar16 = 0;
        for (uVar15 = 0; uVar15 < this->max_board; uVar15 = uVar15 + 1) {
          if (this->BoardList[uVar15] != (BoardIO *)0x0) {
            uVar9 = (*this->BoardList[uVar15]->_vptr_BoardIO[3])();
            uVar3 = uVar9 - 4;
            if (this->IsAllBoardsRev4_6_ == false) {
              uVar3 = uVar9;
            }
            (*this->BoardList[uVar15]->_vptr_BoardIO[4])
                      (this->BoardList[uVar15],
                       puVar1 + (ulong)uVar8 + (ulong)uVar7 +
                       ((long)(int)uVar16 & 0xfffffffffffffffc),0,uVar3 >> 2);
            uVar16 = (ulong)((int)uVar16 + uVar3);
          }
        }
        iVar6 = (*this->_vptr_BasePort[0x28])(this,puVar1 + (ulong)uVar8 + (ulong)uVar7,uVar16);
        bVar17 = 1;
        uVar16 = 0;
        bVar5 = true;
        do {
          if (this->max_board <= uVar16) {
            if (bVar17 == 0) {
              return bVar5;
            }
            (*this->_vptr_BasePort[9])(this);
            return bVar5;
          }
          pBVar2 = this->BoardList[uVar16];
          if (pBVar2 != (BoardIO *)0x0) {
            bVar14 = SUB41(iVar6,0);
            if (this->FirmwareVersion[uVar16] < 7) {
              uVar7 = (*pBVar2->_vptr_BoardIO[3])();
              (*this->BoardList[uVar16]->_vptr_BoardIO[4])
                        (this->BoardList[uVar16],&ctrl,(ulong)((uVar7 >> 2) - 1),1,0);
              bVar19 = ctrl == 0;
              bVar4 = bVar5;
              if (bVar19) {
LAB_0010b820:
                bVar5 = bVar4;
                iVar10 = (*this->BoardList[uVar16]->_vptr_BoardIO[6])();
                bVar12 = bVar19;
                bVar18 = bVar17;
                if ((char)iVar10 == '\0') {
                  iVar10 = (*this->_vptr_BasePort[0x25])(this,uVar16 & 0xff);
                  bVar18 = ((byte)iVar10 ^ 1) & bVar17;
                }
              }
              else {
                bVar18 = 0;
                iVar10 = (*this->_vptr_BasePort[0x24])(this,uVar16 & 0xff,0);
                bVar12 = true;
                bVar4 = false;
                if ((char)iVar10 == '\0') goto LAB_0010b820;
              }
              pBVar2 = this->BoardList[uVar16];
              pBVar2->writeValid = (bool)(bVar12 & bVar14);
              if ((bool)(bVar12 & bVar14) == false) {
                pBVar2->numWriteErrors = pBVar2->numWriteErrors + 1;
              }
              (*pBVar2->_vptr_BoardIO[5])();
              bVar17 = bVar18;
            }
            else {
              pBVar2->writeValid = bVar14;
              if (bVar14 == false) {
                pBVar2->numWriteErrors = pBVar2->numWriteErrors + 1;
                (*pBVar2->_vptr_BoardIO[5])();
              }
              else {
                (*pBVar2->_vptr_BoardIO[5])();
                (*this->BoardList[uVar16]->_vptr_BoardIO[7])();
                bVar17 = 0;
              }
            }
          }
          uVar16 = uVar16 + 1;
        } while( true );
      }
      goto LAB_0010b74f;
    }
    poVar11 = this->outStr;
    pcVar13 = "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware";
  }
  poVar11 = std::operator<<(poVar11,pcVar13);
  std::endl<char,std::char_traits<char>>(poVar11);
LAB_0010b74f:
  (*this->_vptr_BasePort[9])(this);
  return false;
}

Assistant:

bool BasePort::WriteAllBoardsBroadcast(void)
{
    if (!IsOK()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: port not initialized" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!IsBroadcastFirmwareMixValid()) {
        outStr << "BasePort::WriteAllBoardsBroadcast: invalid mix of firmware" << std::endl;
        OnNoneWritten();
        return false;
    }

    if (!CheckFwBusGeneration("WriteAllBoardsBroadcast", autoReScan)) {
        OnNoneWritten();
        return false;
    }

    bool rtWrite = true;   // for debugging

    // sanity check vars
    bool allOK = true;
    bool noneWritten = true;

    // construct broadcast write buffer
    quadlet_t *bcBuffer = reinterpret_cast<quadlet_t *>(WriteBufferBroadcast + GetWriteQuadAlign() + GetPrefixOffset(WR_FW_BDATA));

    int bcBufferOffset = 0; // the offset for new data to be stored in bcBuffer (bytes)
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
            quadlet_t *bcPtr = bcBuffer+bcBufferOffset/sizeof(quadlet_t);
            if (IsAllBoardsRev4_6_) {
                numBytes -= sizeof(quadlet_t);   // for ctrl offset
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            else {
                unsigned int numQuads = numBytes/4;
                BoardList[board]->GetWriteData(bcPtr, 0, numQuads);
            }
            // bcBufferOffset equals total numBytes to write, when the loop ends
            bcBufferOffset = bcBufferOffset + numBytes;
        }
    }

    // now broadcast out the huge packet
    bool ret;

    ret = WriteBroadcastOutput(bcBuffer, bcBufferOffset);

    // Send out control quadlet if necessary (firmware prior to Rev 7);
    //    also check for data collection
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            if (FirmwareVersion[board] < 7) {
                bool noneWrittenThisBoard = true;
                unsigned int numBytes = BoardList[board]->GetWriteNumBytes();
                // Get last quadlet (false -> no byteswapping)
                quadlet_t ctrl;
                BoardList[board]->GetWriteData(&ctrl, (numBytes/sizeof(quadlet_t))-1, 1, false);
                bool ret2 = true;
                if (ctrl) {  // if anything non-zero, write it
                    ret2 = WriteQuadlet(board, 0x00, ctrl);
                    if (ret2) { noneWritten = false; noneWrittenThisBoard = false; }
                    else allOK = false;
                }
                if (noneWrittenThisBoard
                    && !(BoardList[board]->WriteBufferResetsWatchdog())) {
                    // send no-op to reset watchdog
                    bool ret3 = WriteNoOp(board);
                    if (ret3) noneWritten = false;
                }
                BoardList[board]->SetWriteValid(ret&&ret2);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
            }
            else {
                BoardList[board]->SetWriteValid(ret);
                // Initialize (clear) the write buffer
                BoardList[board]->InitWriteBuffer();
                if (ret) {
                    noneWritten = false;
                    // Check for data collection callback
                    BoardList[board]->CheckCollectCallback();
                }
            }
        }
    }

    if (noneWritten) {
        OnNoneWritten();
    }
    if (!rtWrite)
        outStr << "BasePort::WriteAllBoardsBroadcast: rtWrite is false" << std::endl;

    // return
    return allOK;
}